

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

void __thiscall
Fl_Input_Choice::Fl_Input_Choice(Fl_Input_Choice *this,int X,int Y,int W,int H,char *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int H_00;
  Fl_Input *this_00;
  InputMenuButton *this_01;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Group_00277698;
  (this->super_Fl_Group).super_Fl_Widget.box_ = '\x03';
  (this->super_Fl_Group).super_Fl_Widget.label_.align_ = 4;
  this_00 = (Fl_Input *)operator_new(200);
  iVar1 = inp_x(this);
  iVar2 = inp_y(this);
  iVar3 = inp_w(this);
  H_00 = inp_h(this);
  Fl_Input::Fl_Input(this_00,iVar1,iVar2,iVar3,H_00,(char *)0x0);
  this->inp_ = this_00;
  (this_00->super_Fl_Input_).super_Fl_Widget.callback_ = inp_cb;
  (this_00->super_Fl_Input_).super_Fl_Widget.user_data_ = this;
  (this_00->super_Fl_Input_).super_Fl_Widget.box_ = '\x01';
  (this_00->super_Fl_Input_).super_Fl_Widget.when_ = '\x03';
  this_01 = (InputMenuButton *)operator_new(0x98);
  iVar1 = menu_x(this);
  iVar2 = menu_y(this);
  iVar3 = menu_h(this);
  InputMenuButton::InputMenuButton(this_01,iVar1,iVar2,0x14,iVar3,(char *)0x0);
  this->menu_ = this_01;
  (this_01->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.callback_ = menu_cb;
  (this_01->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.user_data_ = this;
  (this_01->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.box_ = '\x01';
  Fl_Group::current_ = (this->super_Fl_Group).super_Fl_Widget.parent_;
  return;
}

Assistant:

Fl_Input_Choice::Fl_Input_Choice (int X,int Y,int W,int H,const char*L) 
: Fl_Group(X,Y,W,H,L) 
{
  Fl_Group::box(FL_DOWN_BOX);
  align(FL_ALIGN_LEFT);				// default like Fl_Input
  inp_ = new Fl_Input(inp_x(), inp_y(),
                      inp_w(), inp_h());
  inp_->callback(inp_cb, (void*)this);
  inp_->box(FL_FLAT_BOX);		// cosmetic
  inp_->when(FL_WHEN_CHANGED|FL_WHEN_NOT_CHANGED);
  menu_ = new InputMenuButton(menu_x(), menu_y(),
                              menu_w(), menu_h());
  menu_->callback(menu_cb, (void*)this);
  menu_->box(FL_FLAT_BOX);				// cosmetic
  end();
}